

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::predict_or_learn_cover<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  uint uVar1;
  v_array<ACTION_SCORE::action_score> *this;
  bool bVar2;
  reference ppeVar3;
  size_t sVar4;
  float *pfVar5;
  action_score *paVar6;
  wclass *pwVar7;
  reference pvVar8;
  action_score *paVar9;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  ulong uVar10;
  v_array<ACTION_SCORE::action_score> *in_RDI;
  float fVar11;
  float fVar12;
  float fVar13;
  __type_conflict _Var14;
  label *in_stack_00000030;
  multi_ex *in_stack_00000038;
  cb_to_cs_adf *in_stack_00000040;
  size_t i_6;
  cb_explore_adf *in_stack_000000d0;
  uint32_t action;
  size_t i_5;
  float add_prob;
  size_t tied_actions_1;
  uint32_t i_4;
  float pseudo_cost;
  uint32_t j;
  size_t i_3;
  float norm;
  uint32_t shared;
  size_t i_2;
  size_t tied_actions;
  uint32_t i_1;
  uint32_t i;
  v_array<ACTION_SCORE::action_score> *probs;
  float min_prob;
  float additive_probability;
  uint32_t num_actions;
  v_array<ACTION_SCORE::action_score> *preds;
  bool is_mtr;
  wclass *in_stack_fffffffffffffe58;
  v_array<COST_SENSITIVE::wclass> *in_stack_fffffffffffffe60;
  action_scores *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  undefined4 in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  float in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  float in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  action_score **in_stack_fffffffffffffed8;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffeec;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffef0;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  float local_e4;
  ulong local_e0;
  ulong local_b0;
  uint local_94;
  uint local_7c;
  action_score *local_78;
  ulong local_68;
  uint local_58;
  uint local_4c;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  uint local_2c;
  v_array<ACTION_SCORE::action_score> *local_28;
  undefined1 local_19;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  v_array<ACTION_SCORE::action_score> *local_8;
  
  local_19 = in_RDI[6]._begin == (action_score *)0x3;
  local_18 = in_RDX;
  local_8 = in_RDI;
  if ((bool)local_19) {
    GEN_CS::gen_cs_example_dr<true>
              ((cb_to_cs_adf *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (multi_ex *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               (label *)in_stack_fffffffffffffea0);
  }
  else {
    GEN_CS::gen_cs_example<false>(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  }
  LEARNER::multiline_learn_or_predict<true>
            ((multi_learner *)in_stack_fffffffffffffee0,(multi_ex *)in_stack_fffffffffffffed8,
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (uint32_t)in_stack_fffffffffffffecc);
  ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
  local_28 = (v_array<ACTION_SCORE::action_score> *)&(*ppeVar3)->pred;
  sVar4 = v_array<ACTION_SCORE::action_score>::size(local_28);
  local_2c = (uint)sVar4;
  local_e4 = (float)local_8[3].end_array;
  local_30 = 1.0 / local_e4;
  local_38 = 1.0 / (float)(sVar4 & 0xffffffff);
  _Var14 = std::sqrt<unsigned_long>(0x3031a4);
  local_3c = 1.0 / (float)_Var14;
  pfVar5 = std::min<float>(&local_38,&local_3c);
  this = local_8;
  local_34 = *pfVar5;
  v_array<ACTION_SCORE::action_score>::clear
            ((v_array<ACTION_SCORE::action_score> *)in_stack_fffffffffffffe60);
  for (local_4c = 0; local_4c < local_2c; local_4c = local_4c + 1) {
    v_array<ACTION_SCORE::action_score>::push_back
              ((v_array<ACTION_SCORE::action_score> *)in_stack_fffffffffffffe60,
               (action_score *)in_stack_fffffffffffffe58);
  }
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)0x30326a);
  for (local_58 = 0; local_58 < local_2c; local_58 = local_58 + 1) {
    v_array<ACTION_SCORE::action_score>::operator[](local_28,(ulong)local_58);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)
               CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               (value_type_conflict3 *)in_stack_fffffffffffffe68);
  }
  if (((ulong)local_8[4].end_array & 0x100) == 0) {
    sVar4 = fill_tied((cb_explore_adf *)
                      CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                      (v_array<ACTION_SCORE::action_score> *)
                      CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    for (local_68 = 0; local_68 < sVar4; local_68 = local_68 + 1) {
      in_stack_ffffffffffffff00 = (float)(long)sVar4;
      in_stack_ffffffffffffff04 = (float)sVar4;
      fVar11 = local_30 / in_stack_ffffffffffffff04;
      in_stack_fffffffffffffef0 = this;
      paVar6 = v_array<ACTION_SCORE::action_score>::operator[](local_28,local_68);
      paVar6 = v_array<ACTION_SCORE::action_score>::operator[]
                         (in_stack_fffffffffffffef0,(ulong)paVar6->action);
      paVar6->score = fVar11 + paVar6->score;
    }
  }
  else {
    in_stack_fffffffffffffee0 = this;
    in_stack_fffffffffffffeec = local_30;
    paVar6 = v_array<ACTION_SCORE::action_score>::operator[](local_28,0);
    paVar6 = v_array<ACTION_SCORE::action_score>::operator[]
                       (in_stack_fffffffffffffee0,(ulong)paVar6->action);
    paVar6->score = in_stack_fffffffffffffeec + paVar6->score;
  }
  std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
  bVar2 = CB::ec_is_example_header
                    ((example *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  for (local_78 = (action_score *)0x1; local_78 < local_8[3].end_array;
      local_78 = (action_score *)((long)&local_78->action + 1)) {
    v_array<COST_SENSITIVE::wclass>::clear(in_stack_fffffffffffffe60);
    if (bVar2 != 0) {
      in_stack_fffffffffffffed8 = &local_8[0xd].end_array;
      v_array<COST_SENSITIVE::wclass>::operator[]
                ((v_array<COST_SENSITIVE::wclass> *)&local_8[9].end_array,0);
      v_array<COST_SENSITIVE::wclass>::push_back
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    }
    for (local_7c = 0; local_7c < local_2c; local_7c = local_7c + 1) {
      pwVar7 = v_array<COST_SENSITIVE::wclass>::operator[]
                         ((v_array<COST_SENSITIVE::wclass> *)&local_8[9].end_array,
                          (ulong)(local_7c + bVar2));
      in_stack_fffffffffffffed4 = pwVar7->x;
      in_stack_fffffffffffffed0 = *(float *)&local_8[3].erase_count * local_34;
      paVar6 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)local_7c);
      std::max<float>(&paVar6->score,&local_34);
      v_array<COST_SENSITIVE::wclass>::push_back
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    }
    in_stack_fffffffffffffe58 = (wclass *)((long)&local_78->action + 1);
    GEN_CS::call_cs_ldf<true>
              ((multi_learner *)in_stack_fffffffffffffef0,
               (multi_ex *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (v_array<CB::label> *)in_stack_fffffffffffffee0,(label *)in_stack_fffffffffffffed8,
               (v_array<COST_SENSITIVE::label> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    for (local_94 = 0; local_94 < local_2c; local_94 = local_94 + 1) {
      paVar6 = v_array<ACTION_SCORE::action_score>::operator[](local_28,(ulong)local_94);
      in_stack_fffffffffffffecc = paVar6->score;
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_8 + 1),(ulong)local_94);
      *pvVar8 = in_stack_fffffffffffffecc + *pvVar8;
    }
    if (((ulong)local_8[4].end_array & 0x100) == 0) {
      sVar4 = fill_tied((cb_explore_adf *)
                        CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                        (v_array<ACTION_SCORE::action_score> *)
                        CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
      in_stack_fffffffffffffec8 = (float)sVar4;
      fVar11 = local_30 / in_stack_fffffffffffffec8;
      for (local_b0 = 0; local_b0 < sVar4; local_b0 = local_b0 + 1) {
        paVar6 = v_array<ACTION_SCORE::action_score>::operator[](local_28,local_b0);
        paVar6 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)paVar6->action);
        if (paVar6->score < local_34) {
          in_stack_fffffffffffffea0 = this;
          fVar13 = local_34;
          fVar12 = fVar11;
          paVar6 = v_array<ACTION_SCORE::action_score>::operator[](local_28,local_b0);
          paVar6 = v_array<ACTION_SCORE::action_score>::operator[]
                             (in_stack_fffffffffffffea0,(ulong)paVar6->action);
          fVar12 = fVar12 - (fVar13 - paVar6->score);
          uVar10 = (ulong)fVar12;
          max(0,uVar10 | (long)(fVar12 - 9.223372e+18) & (long)uVar10 >> 0x3f);
        }
        in_stack_fffffffffffffe90 = this;
        in_stack_fffffffffffffe9c = fVar11;
        paVar6 = v_array<ACTION_SCORE::action_score>::operator[](local_28,local_b0);
        paVar6 = v_array<ACTION_SCORE::action_score>::operator[]
                           (in_stack_fffffffffffffe90,(ulong)paVar6->action);
        paVar6->score = in_stack_fffffffffffffe9c + paVar6->score;
      }
    }
    else {
      paVar6 = v_array<ACTION_SCORE::action_score>::operator[](local_28,0);
      uVar1 = paVar6->action;
      paVar6 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)uVar1);
      fVar13 = local_30;
      fVar11 = local_34;
      if (paVar6->score < local_34) {
        paVar6 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)uVar1);
        fVar13 = fVar13 - (fVar11 - paVar6->score);
        uVar10 = (ulong)fVar13;
        max(0,uVar10 | (long)(fVar13 - 9.223372e+18) & (long)uVar10 >> 0x3f);
      }
      in_stack_fffffffffffffe7c = local_30;
      paVar6 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)uVar1);
      paVar6->score = in_stack_fffffffffffffe7c + paVar6->score;
    }
  }
  ACTION_SCORE::begin_scores(in_stack_fffffffffffffe68);
  ACTION_SCORE::end_scores(in_stack_fffffffffffffe68);
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            ((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffea0 >> 0x18,0),
             (score_iterator *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (score_iterator *)in_stack_fffffffffffffe90);
  do_sort(in_stack_000000d0);
  for (local_e0 = 0; local_e0 < local_2c; local_e0 = local_e0 + 1) {
    paVar6 = v_array<ACTION_SCORE::action_score>::operator[](this,local_e0);
    paVar9 = v_array<ACTION_SCORE::action_score>::operator[](local_28,local_e0);
    *paVar9 = *paVar6;
  }
  local_8[5]._begin = (action_score *)((long)&(local_8[5]._begin)->action + 1);
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.
  const bool is_mtr = data.gen_cs.cb_type == CB_TYPE_MTR;
  if (is_learn)
  {
    if (is_mtr)  // use DR estimates for non-ERM policies in MTR
      GEN_CS::gen_cs_example_dr<true>(data.gen_cs, examples, data.cs_labels);
    else
      GEN_CS::gen_cs_example<false>(data.gen_cs, examples, data.cs_labels);
    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
  {
    GEN_CS::gen_cs_example_ips(examples, data.cs_labels);
    multiline_learn_or_predict<false>(base, examples, data.offset);
  }

  v_array<action_score>& preds = examples[0]->pred.a_s;
  const uint32_t num_actions = (uint32_t)preds.size();

  float additive_probability = 1.f / (float)data.cover_size;
  const float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));
  v_array<action_score>& probs = data.action_probs;
  probs.clear();
  for (uint32_t i = 0; i < num_actions; i++) probs.push_back({i, 0.});
  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(preds[i].score);

  if (!data.first_only)
  {
    size_t tied_actions = fill_tied(data, preds);
    for (size_t i = 0; i < tied_actions; ++i) probs[preds[i].action].score += additive_probability / tied_actions;
  }
  else
    probs[preds[0].action].score += additive_probability;

  const uint32_t shared = CB::ec_is_example_header(*examples[0]) ? 1 : 0;

  float norm = min_prob * num_actions + (additive_probability - min_prob);
  for (size_t i = 1; i < data.cover_size; i++)
  {
    // Create costs of each action based on online cover
    if (is_learn)
    {
      data.cs_labels_2.costs.clear();
      if (shared > 0)
        data.cs_labels_2.costs.push_back(data.cs_labels.costs[0]);
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost =
            data.cs_labels.costs[j + shared].x - data.psi * min_prob / (max(probs[j].score, min_prob) / norm);
        data.cs_labels_2.costs.push_back({pseudo_cost, j, 0., 0.});
      }
      GEN_CS::call_cs_ldf<true>(*(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels_2,
          data.prepped_cs_labels, data.offset, i + 1);
    }
    else
      GEN_CS::call_cs_ldf<false>(
          *(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset, i + 1);

    for (uint32_t i = 0; i < num_actions; i++) data.scores[i] += preds[i].score;
    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      const float add_prob = additive_probability / tied_actions;
      for (size_t i = 0; i < tied_actions; ++i)
      {
        if (probs[preds[i].action].score < min_prob)
          norm += max(0, add_prob - (min_prob - probs[preds[i].action].score));
        else
          norm += add_prob;
        probs[preds[i].action].score += add_prob;
      }
    }
    else
    {
      uint32_t action = preds[0].action;
      if (probs[action].score < min_prob)
        norm += max(0, additive_probability - (min_prob - probs[action].score));
      else
        norm += additive_probability;
      probs[action].score += additive_probability;
    }
  }

  enforce_minimum_probability(min_prob * num_actions, !data.nounif, begin_scores(probs), end_scores(probs));

  do_sort(data);
  for (size_t i = 0; i < num_actions; i++) preds[i] = probs[i];

  ++data.counter;
}